

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O3

void __thiscall Pathie::Path::rmtree(Path *this)

{
  bool bVar1;
  char *in_RSI;
  Path *__path;
  pointer path;
  vector<Pathie::Path,_std::allocator<Pathie::Path>_> kids;
  vector<Pathie::Path,_std::allocator<Pathie::Path>_> local_88;
  Path local_70;
  Path local_50;
  
  bVar1 = is_directory(this);
  if (bVar1) {
    __path = this;
    children(&local_88,this);
    if (local_88.super__Vector_base<Pathie::Path,_std::allocator<Pathie::Path>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_88.super__Vector_base<Pathie::Path,_std::allocator<Pathie::Path>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      path = local_88.super__Vector_base<Pathie::Path,_std::allocator<Pathie::Path>_>._M_impl.
             super__Vector_impl_data._M_start;
      do {
        Path(&local_70,path);
        __path = this;
        join(&local_50,this,&local_70);
        rmtree(&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50.m_path._M_dataplus._M_p != &local_50.m_path.field_2) {
          operator_delete(local_50.m_path._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70.m_path._M_dataplus._M_p != &local_70.m_path.field_2) {
          operator_delete(local_70.m_path._M_dataplus._M_p);
        }
        path = path + 1;
      } while (path != local_88.super__Vector_base<Pathie::Path,_std::allocator<Pathie::Path>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
    }
    rmdir(this,(char *)__path);
    std::vector<Pathie::Path,_std::allocator<Pathie::Path>_>::~vector(&local_88);
    return;
  }
  unlink(this,in_RSI);
  return;
}

Assistant:

void Path::rmtree() const
{
  if (is_directory()) {
    std::vector<Path> kids = children();

    for(std::vector<Path>::iterator iter=kids.begin(); iter != kids.end(); iter++) {
       join(*iter).rmtree();
    }

    rmdir();
  }
  else { // file or similar
    unlink();
  }
}